

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O1

void __thiscall logger::OutputWorker::OutputWorker(OutputWorker *this)

{
  *(undefined8 *)((long)&(this->StartStopLock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->StartStopLock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->StartStopLock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->QueueLock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->QueueLock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->QueueLock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->QueueLock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->QueueLock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->StartStopLock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->StartStopLock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->StartStopLock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->StartStopLock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->StartStopLock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->QueueLock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->QueueLock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->QueueLock).super___mutex_base._M_mutex + 0x10) = 0;
  std::condition_variable::condition_variable(&this->QueueCondition);
  (this->QueuePublic).
  super__List_base<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->QueuePublic;
  (this->QueuePublic).
  super__List_base<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->QueuePublic;
  (this->QueuePublic).
  super__List_base<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
  ._M_impl._M_node._M_size = 0;
  (this->QueuePrivate).
  super__List_base<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->QueuePrivate;
  (this->QueuePrivate).
  super__List_base<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->QueuePrivate;
  (this->QueuePrivate).
  super__List_base<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
  ._M_impl._M_node._M_size = 0;
  (this->Overrun).super___atomic_base<int>._M_i = 0;
  (this->FlushRequested)._M_base._M_i = false;
  std::condition_variable::condition_variable(&this->FlushCondition);
  (this->Thread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->Thread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->Terminated)._M_base._M_i = true;
  Start(this);
  atexit(AtExitWrapper);
  return;
}

Assistant:

OutputWorker::OutputWorker()
{
    Start();

#if !defined(LOGGER_DISABLE_ATEXIT)
    // Register an atexit() callback so we do not need manual shutdown in app code
    // Application code can still manually shutdown by calling OutputWorker::Stop()
    std::atexit(AtExitWrapper);
#endif // LOGGER_DISABLE_ATEXIT
}